

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cFramebufferNoAttachmentsTests.cpp
# Opt level: O3

void __thiscall
glcts::FramebufferNoAttachmentsApiCase::end_fbo(FramebufferNoAttachmentsApiCase *this,GLenum target)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_FramebufferNoAttachmentsBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x78))(target,0);
  (**(code **)(lVar2 + 0x440))(1,&this->m_fbo);
  (**(code **)(lVar2 + 0x460))(1,&this->m_renderbuffer);
  (**(code **)(lVar2 + 0x480))(1,&this->m_texture);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"error deleting framebuffer / renderbuffer / texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cFramebufferNoAttachmentsTests.cpp"
                  ,0xb9);
  this->m_fbo = 0;
  this->m_renderbuffer = 0;
  this->m_texture = 0;
  return;
}

Assistant:

void FramebufferNoAttachmentsApiCase::end_fbo(GLenum target)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(target, 0);
	gl.deleteFramebuffers(1, &m_fbo);
	gl.deleteRenderbuffers(1, &m_renderbuffer);
	gl.deleteTextures(1, &m_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "error deleting framebuffer / renderbuffer / texture");
	m_fbo		   = 0;
	m_renderbuffer = 0;
	m_texture	  = 0;
}